

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.h
# Opt level: O2

int __thiscall cppcms::impl::directory::close(directory *this,int __fd)

{
  int in_EAX;
  
  this->entry_p_ = (dirent *)0x0;
  if ((DIR *)this->dir_ != (DIR *)0x0) {
    in_EAX = closedir((DIR *)this->dir_);
    this->dir_ = (DIR *)0x0;
  }
  return in_EAX;
}

Assistant:

inline void directory::close()
{
	#ifdef CPPCMS_DIR_ALLOCATE_DE
	if(de_)  {
		free(de_);
		de_ = 0;
	}
	#endif
	entry_p_ = 0;
	if(dir_) {
		closedir(dir_);
		dir_=0;
	}
}